

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

Value * anon_unknown.dwarf_fe19af::ReadJson(Value *__return_storage_ptr__,string *jsonstr)

{
  pointer pcVar1;
  optional<(anonymous_namespace)::Args> errorPath;
  int iVar2;
  Value *this;
  CharReader *pCVar3;
  json_error *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  allocator<char> local_b1;
  string error;
  String local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  uint7 uStack_57;
  CharReaderBuilder builder;
  
  Json::CharReaderBuilder::CharReaderBuilder(&builder);
  Json::Value::Value((Value *)&error,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"collectComments",&local_b1);
  this = Json::CharReaderBuilder::operator[](&builder,&local_88);
  Json::Value::operator=(this,(Value *)&error);
  std::__cxx11::string::~string((string *)&local_88);
  Json::Value::~Value((Value *)&error);
  pCVar3 = Json::CharReaderBuilder::newCharReader(&builder);
  Json::Value::Value(__return_storage_ptr__,nullValue);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  pcVar1 = (jsonstr->_M_dataplus)._M_p;
  iVar2 = (*pCVar3->_vptr_CharReader[2])
                    (pCVar3,pcVar1,pcVar1 + jsonstr->_M_string_length,__return_storage_ptr__,&error)
  ;
  if ((char)iVar2 != '\0') {
    std::__cxx11::string::~string((string *)&error);
    (*pCVar3->_vptr_CharReader[1])(pCVar3);
    Json::CharReaderBuilder::~CharReaderBuilder(&builder);
    return __return_storage_ptr__;
  }
  this_00 = (json_error *)__cxa_allocate_exception(0x28);
  local_88._M_dataplus._M_p = (pointer)0x1c;
  local_88._M_string_length = 0x63b8bc;
  local_88.field_2._M_allocated_capacity = error._M_string_length;
  local_88.field_2._8_8_ = error._M_dataplus._M_p;
  local_58 = 0;
  errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
  super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .End._M_current =
       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )uStack_60;
  errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
  super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .Begin._M_current =
       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )local_68;
  errorPath.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
  super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = (ulong)uStack_57 << 8;
  message._M_len = 2;
  message._M_array = (iterator)&local_88;
  json_error::json_error(this_00,message,errorPath);
  __cxa_throw(this_00,&(anonymous_namespace)::json_error::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

Json::Value ReadJson(const std::string& jsonstr)
{
  Json::CharReaderBuilder builder;
  builder["collectComments"] = false;
  auto jsonReader = std::unique_ptr<Json::CharReader>(builder.newCharReader());
  Json::Value json;
  std::string error;
  if (!jsonReader->parse(jsonstr.data(), jsonstr.data() + jsonstr.size(),
                         &json, &error)) {
    throw json_error({ "failed parsing json string: "_s, error });
  }
  return json;
}